

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void initialize_tls_values(thread_local_state *tls)

{
  void *in_RDI;
  ALLEGRO_BLENDER *in_stack_00000010;
  ALLEGRO_EXTRA_DISPLAY_SETTINGS *in_stack_00000020;
  
  memset(in_RDI,0,0x228);
  *(undefined4 *)((long)in_RDI + 8) = 0xffffffff;
  *(undefined4 *)((long)in_RDI + 0xc) = 0x7fffffff;
  *(undefined4 *)((long)in_RDI + 0x10) = 0x7fffffff;
  initialize_blender(in_stack_00000010);
  *(undefined4 *)((long)in_RDI + 0x10c) = 0x1000;
  *(undefined4 *)((long)in_RDI + 0x108) = 2;
  *(ALLEGRO_FILE_INTERFACE **)((long)in_RDI + 0x110) = &_al_file_interface_stdio;
  *(ALLEGRO_FS_INTERFACE **)((long)in_RDI + 0x118) = &_al_fs_interface_stdio;
  memset((void *)((long)in_RDI + 0x124),0,0x100);
  _al_fill_display_settings(in_stack_00000020);
  return;
}

Assistant:

static void initialize_tls_values(thread_local_state *tls)
{
   memset(tls, 0, sizeof *tls);

   tls->new_display_adapter = ALLEGRO_DEFAULT_DISPLAY_ADAPTER;
   tls->new_window_x = INT_MAX;
   tls->new_window_y = INT_MAX;

   initialize_blender(&tls->current_blender);
   tls->new_bitmap_flags = ALLEGRO_CONVERT_BITMAP;
   tls->new_bitmap_format = ALLEGRO_PIXEL_FORMAT_ANY_WITH_ALPHA;
   tls->new_file_interface = &_al_file_interface_stdio;
   tls->fs_interface = &_al_fs_interface_stdio;
   memset(tls->new_window_title, 0, ALLEGRO_NEW_WINDOW_TITLE_MAX_SIZE + 1);

   _al_fill_display_settings(&tls->new_display_settings);
}